

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void SendTimestepEntryToSingleReader
               (SstStream Stream,CPTimestepList Entry,WS_ReaderInfo CP_WSR_Stream,int rank)

{
  SstStream Stream_00;
  size_t sVar1;
  uint in_ECX;
  void **in_RDX;
  size_t *in_RSI;
  SstStream in_RDI;
  WS_ReaderInfo unaff_retaddr;
  SstPreloadModeType PMode;
  FFSFormatList ToSend;
  size_t PriorSent;
  undefined4 uVar2;
  ssize_t in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  SstPreloadModeType SVar3;
  
  if (*(int *)(in_RDX + 1) == 2) {
    in_RDX[4] = (void *)*in_RSI;
    Stream_00 = (SstStream)ReturnNthListEntry(in_RDI->PreviousFormats,(size_t)in_RDX[0xc]);
    *(SstStream *)(in_RSI[3] + 0x18) = Stream_00;
    if (in_ECX != 0xffffffff) {
      CP_verbose(in_RDI,PerRankVerbose,"Sent timestep %zd to reader cohort %d\n",*in_RSI,
                 (ulong)in_ECX);
    }
    *(int *)((long)in_RSI + 0x24) = *(int *)((long)in_RSI + 0x24) + 1;
    *(int *)(in_RSI + 4) = (int)in_RSI[4] + 1;
    uVar2 = *(undefined4 *)((long)in_RSI + 0x24);
    CP_verbose(in_RDI,PerRankVerbose,
               "ADDING timestep %zd to sent list for reader cohort %d, READER %p, reference count is now %d\n"
               ,*in_RSI,(ulong)in_ECX,in_RDX,uVar2);
    AddTSToSentList(Stream_00,
                    (WS_ReaderInfo)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                    in_stack_ffffffffffffffc0);
    SVar3 = SstPreloadNone;
    if (((long)in_RDX[10] <= (long)*in_RSI) && (*(int *)(in_RDX + 9) != 0)) {
      SVar3 = *(SstPreloadModeType *)(in_RDX + 9);
      CP_verbose(in_RDI,PerStepVerbose,
                 "PRELOADMODE for timestep %zd non-default for reader , active at timestep %zd, mode %d\n"
                 ,*in_RSI,in_RDX[10],(ulong)SVar3,uVar2);
    }
    *(SstPreloadModeType *)(in_RSI[3] + 0x14) = SVar3;
    sVar1 = FormatListCount((FFSFormatList)Stream_00);
    in_RDX[0xc] = (void *)(sVar1 + (long)in_RDX[0xc]);
    pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->DataLock);
    if (in_RDI->DP_Interface->readerRegisterTimestep != (CP_DP_PerReaderTimestepRegFunc)0x0) {
      (*in_RDI->DP_Interface->readerRegisterTimestep)(&Svcs,in_RDX[0xe],*in_RSI,SVar3);
    }
    pthread_mutex_lock((pthread_mutex_t *)&in_RDI->DataLock);
    if (*(int *)(in_RDX + 1) == 2) {
      sendOneToWSRCohort(unaff_retaddr,(CMFormat)in_RDI,in_RSI,in_RDX);
    }
  }
  return;
}

Assistant:

static void SendTimestepEntryToSingleReader(SstStream Stream, CPTimestepList Entry,
                                            WS_ReaderInfo CP_WSR_Stream, int rank)
{
    STREAM_ASSERT_LOCKED(Stream);
    if (CP_WSR_Stream->ReaderStatus == Established)
    {
        size_t PriorSent = CP_WSR_Stream->FormatSentCount;
        CP_WSR_Stream->LastSentTimestep = Entry->Timestep;
        FFSFormatList ToSend = ReturnNthListEntry(Stream->PreviousFormats, PriorSent);
        Entry->Msg->Formats = ToSend;

        if (rank != -1)
        {
            CP_verbose(Stream, PerRankVerbose, "Sent timestep %zd to reader cohort %d\n",
                       Entry->Timestep, rank);
        }
        Entry->ReferenceCount++;
        Entry->MetaDataSendCount++;
        CP_verbose(Stream, PerRankVerbose,
                   "ADDING timestep %zd to sent list for reader cohort %d, "
                   "READER %p, reference count is now %d\n",
                   Entry->Timestep, rank, CP_WSR_Stream, Entry->ReferenceCount);
        AddTSToSentList(Stream, CP_WSR_Stream, Entry->Timestep);
        SstPreloadModeType PMode = SstPreloadNone;

        if ((Entry->Timestep >= CP_WSR_Stream->PreloadModeActiveTimestep) &&
            (CP_WSR_Stream->PreloadMode != SstPreloadNone))
        {
            PMode = CP_WSR_Stream->PreloadMode;
            CP_verbose(Stream, PerStepVerbose,
                       "PRELOADMODE for timestep %zd non-default for reader , "
                       "active at timestep %zd, mode %d\n",
                       Entry->Timestep, CP_WSR_Stream->PreloadModeActiveTimestep, PMode);
        }
        Entry->Msg->PreloadMode = PMode;
        CP_WSR_Stream->FormatSentCount += FormatListCount(ToSend);
        STREAM_MUTEX_UNLOCK(Stream);
        if (Stream->DP_Interface->readerRegisterTimestep)
        {
            (Stream->DP_Interface->readerRegisterTimestep)(&Svcs, CP_WSR_Stream->DP_WSR_Stream,
                                                           Entry->Timestep, PMode);
        }

        STREAM_MUTEX_LOCK(Stream);
        if (CP_WSR_Stream->ReaderStatus == Established)
            sendOneToWSRCohort(CP_WSR_Stream,
                               Stream->CPInfo->SharedCM->DeliverTimestepMetadataFormat, Entry->Msg,
                               &Entry->Msg->RS_Stream);
    }
}